

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll_kqueue.c
# Opt level: O0

void us_poll_change(us_poll_t *p,us_loop_t *loop,int events)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint in_EDX;
  long in_RSI;
  us_poll_t *in_RDI;
  epoll_event event;
  int old_events;
  undefined1 local_24 [16];
  uint local_14;
  long local_10;
  us_poll_t *local_8;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_24._12_4_ = us_poll_events(in_RDI);
  if (local_24._12_4_ != local_14) {
    uVar1 = us_internal_poll_type(local_8);
    uVar2 = 0;
    if ((local_14 & 1) != 0) {
      uVar2 = 8;
    }
    uVar3 = 0;
    if ((local_14 & 4) != 0) {
      uVar3 = 4;
    }
    local_8->state =
         (anon_struct_4_2_c726803f_for_state)
         ((uint)local_8->state & 0xfffffff | (uVar1 | uVar2 | uVar3) << 0x1c);
    local_24._0_4_ = local_14;
    local_24._4_8_ = local_8;
    epoll_ctl(*(int *)(local_10 + 100),3,((int)local_8->state << 4) >> 4,(epoll_event *)local_24);
  }
  return;
}

Assistant:

void us_poll_change(struct us_poll_t *p, struct us_loop_t *loop, int events) {
    int old_events = us_poll_events(p);
    if (old_events != events) {

        p->state.poll_type = us_internal_poll_type(p) | ((events & LIBUS_SOCKET_READABLE) ? POLL_TYPE_POLLING_IN : 0) | ((events & LIBUS_SOCKET_WRITABLE) ? POLL_TYPE_POLLING_OUT : 0);

#ifdef LIBUS_USE_EPOLL
        struct epoll_event event;
        event.events = events;
        event.data.ptr = p;
        epoll_ctl(loop->fd, EPOLL_CTL_MOD, p->state.fd, &event);
#else
        kqueue_change(loop->fd, p->state.fd, old_events, events, p);
#endif
        /* Set all removed events to null-polls in pending ready poll list */
        //us_internal_loop_update_pending_ready_polls(loop, p, p, old_events, events);
    }
}